

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_begin_titled(nk_context *ctx,char *name,char *title,nk_rect bounds,nk_flags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  uint uVar14;
  nk_user_font *pnVar15;
  nk_window *pnVar16;
  int iVar17;
  nk_hash hash;
  uint uVar18;
  nk_window *win;
  nk_window *pnVar19;
  nk_panel *pnVar20;
  nk_window *win_00;
  nk_size nVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined8 uVar26;
  nk_rect b;
  nk_rect rect;
  float local_78;
  float fStack_74;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3f36,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  if (name == (char *)0x0) {
    __assert_fail("name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3f37,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  if (title == (char *)0x0) {
    __assert_fail("title",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3f38,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  pnVar15 = (ctx->style).font;
  if ((pnVar15 == (nk_user_font *)0x0) || (pnVar15->width == (nk_text_width_f)0x0)) {
    __assert_fail("ctx->style.font && ctx->style.font->width && \"if this triggers you forgot to add a font\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3f39,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    __assert_fail("!ctx->current && \"if this triggers you missed a `nk_end` call\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3f3a,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  iVar17 = nk_strlen(name);
  hash = nk_murmur_hash(name,iVar17,0x40);
  win = nk_find_window(ctx,hash,name);
  local_78 = bounds.x;
  fStack_74 = bounds.y;
  if (win == (nk_window *)0x0) {
    uVar18 = nk_strlen(name);
    win = (nk_window *)nk_create_window(ctx);
    nk_insert_window(ctx,win,flags >> 8 & NK_INSERT_FRONT);
    (win->buffer).base = &ctx->memory;
    (win->buffer).use_clipping = 1;
    nVar21 = (ctx->memory).allocated;
    (win->buffer).begin = nVar21;
    (win->buffer).end = nVar21;
    (win->buffer).last = nVar21;
    win->flags = flags;
    (win->bounds).x = (float)(int)bounds._0_8_;
    (win->bounds).y = (float)(int)((ulong)bounds._0_8_ >> 0x20);
    (win->bounds).w = (float)(int)bounds._8_8_;
    (win->bounds).h = (float)(int)((ulong)bounds._8_8_ >> 0x20);
    win->name = hash;
    nVar21 = 0x3f;
    if (uVar18 < 0x3f) {
      nVar21 = (nk_size)uVar18;
    }
    nk_memcopy(win->name_string,name,nVar21);
    win->name_string[nVar21] = '\0';
    (win->popup).win = (nk_window *)0x0;
    if (ctx->active == (nk_window *)0x0) {
      ctx->active = win;
    }
  }
  else {
    uVar18 = win->flags & 0xfffff800 | flags;
    win->flags = uVar18;
    if ((flags & 6) == 0) {
      (win->bounds).x = local_78;
      (win->bounds).y = fStack_74;
      (win->bounds).w = bounds.w;
      (win->bounds).h = bounds.h;
    }
    if (win->seq == ctx->seq) {
      __assert_fail("win->seq != ctx->seq",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                    ,0x3f65,
                    "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                   );
    }
    win->seq = ctx->seq;
    if ((ctx->active == (nk_window *)0x0) && ((uVar18 & 0x2000) == 0)) {
      ctx->active = win;
      ctx->end = win;
    }
  }
  uVar18 = win->flags;
  if ((uVar18 >> 0xd & 1) != 0) {
    ctx->current = win;
    win->layout = (nk_panel *)0x0;
    return 0;
  }
  nVar21 = (ctx->memory).allocated;
  (win->buffer).begin = nVar21;
  (win->buffer).end = nVar21;
  (win->buffer).last = nVar21;
  (win->buffer).clip = nk_null_rect;
  if ((uVar18 >> 10 & 1) != 0) goto LAB_0012acd8;
  fVar24 = (ctx->style).window.header.padding.y;
  fVar3 = (ctx->style).window.header.label_padding.y;
  fVar24 = fVar3 + fVar3 + fVar24 + fVar24 + ((ctx->style).font)->height;
  if ((short)uVar18 < 0) {
    uVar4 = (win->bounds).x;
    uVar10 = (win->bounds).y;
    fVar3 = (win->bounds).w;
    fVar2 = (float)uVar4;
    fVar8 = (float)uVar10;
    fVar23 = fVar24;
  }
  else {
    fVar2 = (win->bounds).x;
    fVar8 = (win->bounds).y;
    fVar3 = (win->bounds).w;
    uVar9 = (win->bounds).h;
    fVar23 = (float)uVar9;
  }
  bVar22 = false;
  rect.y = fVar8;
  rect.x = fVar2;
  rect.h = fVar23;
  rect.w = fVar3;
  b.y = fVar8;
  b.x = fVar2;
  b.h = fVar23;
  b.w = fVar3;
  iVar17 = nk_input_has_mouse_click_down_in_rect(&ctx->input,NK_BUTTON_LEFT,b,1);
  if (iVar17 != 0) {
    bVar22 = (ctx->input).mouse.buttons[0].clicked != 0;
  }
  iVar17 = nk_input_is_mouse_hovering_rect(&ctx->input,rect);
  win_00 = win;
  if (((win != ctx->active) && (iVar17 != 0)) && ((ctx->input).mouse.buttons[0].down == 0)) {
    do {
      win_00 = win_00->next;
      if (win_00 == (nk_window *)0x0) {
        pnVar19 = ctx->end;
        goto LAB_0012ac84;
      }
      uVar14 = win_00->flags;
      if ((short)uVar14 < 0) {
        uVar26 = CONCAT44(fVar24,(win_00->bounds).w);
      }
      else {
        uVar26._0_4_ = (win_00->bounds).w;
        uVar26._4_4_ = (win_00->bounds).h;
      }
      uVar7 = (win_00->bounds).x;
      uVar13 = (win_00->bounds).y;
    } while ((((fVar3 + fVar2 < (float)uVar7) || ((float)uVar26 + (float)uVar7 < fVar2)) ||
             (((uVar14 >> 0xd & 1) != 0 ||
              ((fVar23 + fVar8 < (float)uVar13 ||
               ((float)((ulong)uVar26 >> 0x20) + (float)uVar13 < fVar8)))))) &&
            ((pnVar19 = (win_00->popup).win, pnVar19 == (nk_window *)0x0 ||
             ((((((uVar14 >> 0xd & 1) != 0 || ((win_00->popup).active == 0)) ||
                (fVar5 = (pnVar19->bounds).x, fVar3 + fVar2 < fVar5)) ||
               ((fVar5 + (pnVar19->bounds).w < fVar2 ||
                (fVar5 = (pnVar19->bounds).y, fVar23 + fVar8 < fVar5)))) ||
              (fVar5 + (pnVar19->bounds).h < fVar8))))));
  }
  if ((bVar22) && (pnVar19 = ctx->end, win != pnVar19)) {
    win_00 = win;
    do {
      win_00 = win_00->next;
      if (win_00 == (nk_window *)0x0) goto LAB_0012ac84;
      uVar14 = win_00->flags;
      if ((short)uVar14 < 0) {
        fVar5 = (win_00->bounds).w;
        fVar25 = fVar24;
      }
      else {
        fVar5 = (win_00->bounds).w;
        uVar11 = (win_00->bounds).h;
        fVar25 = (float)uVar11;
      }
      uVar6 = (win_00->bounds).x;
      uVar12 = (win_00->bounds).y;
      fVar1 = (ctx->input).mouse.pos.x;
      if ((((float)uVar6 <= fVar1) && (fVar1 < fVar5 + (float)uVar6)) && ((uVar14 >> 0xd & 1) == 0))
      {
        fVar5 = (ctx->input).mouse.pos.y;
        if (((float)uVar12 <= fVar5) && (fVar5 < fVar25 + (float)uVar12)) break;
      }
      pnVar16 = (win_00->popup).win;
    } while ((((pnVar16 == (nk_window *)0x0) ||
              (((uVar14 >> 0xd & 1) != 0 || ((win_00->popup).active == 0)))) ||
             (fVar5 = (pnVar16->bounds).x, fVar3 + fVar2 < fVar5)) ||
            (((fVar5 + (pnVar16->bounds).w < fVar2 ||
              (fVar5 = (pnVar16->bounds).y, fVar23 + fVar8 < fVar5)) ||
             (fVar5 + (pnVar16->bounds).h < fVar8))));
  }
  if ((uVar18 & 0x1100) == 0x100) {
    win->flags = uVar18 | 0x1000;
    uVar18 = win_00->flags;
    win_00->flags = uVar18 & 0xffffefff;
    ctx->active = win_00;
    if ((uVar18 >> 8 & 1) == 0) {
      nk_remove_window(ctx,win_00);
      nk_insert_window(ctx,win_00,NK_INSERT_BACK);
    }
    goto LAB_0012acd8;
  }
LAB_0012acbc:
  if ((ctx->end != win) && ((uVar18 & 0x100) == 0)) {
    win->flags = uVar18 | 0x1000;
  }
LAB_0012acd8:
  pnVar20 = (nk_panel *)nk_create_panel(ctx);
  win->layout = pnVar20;
  ctx->current = win;
  iVar17 = nk_panel_begin(ctx,title,NK_PANEL_WINDOW);
  pnVar20 = win->layout;
  pnVar20->offset_x = &(win->scrollbar).x;
  pnVar20->offset_y = &(win->scrollbar).y;
  return iVar17;
LAB_0012ac84:
  if (pnVar19 != win) {
    if ((uVar18 >> 8 & 1) == 0) {
      nk_remove_window(ctx,win);
      nk_insert_window(ctx,win,NK_INSERT_BACK);
      uVar18 = win->flags;
    }
    uVar18 = uVar18 & 0xffffefff;
    win->flags = uVar18;
    ctx->active = win;
  }
  goto LAB_0012acbc;
}

Assistant:

NK_API int
nk_begin_titled(struct nk_context *ctx, const char *name, const char *title,
    struct nk_rect bounds, nk_flags flags)
{
    struct nk_window *win;
    struct nk_style *style;
    nk_hash title_hash;
    int title_len;
    int ret = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(name);
    NK_ASSERT(title);
    NK_ASSERT(ctx->style.font && ctx->style.font->width && "if this triggers you forgot to add a font");
    NK_ASSERT(!ctx->current && "if this triggers you missed a `nk_end` call");
    if (!ctx || ctx->current || !title || !name)
        return 0;

    /* find or create window */
    style = &ctx->style;
    title_len = (int)nk_strlen(name);
    title_hash = nk_murmur_hash(name, (int)title_len, NK_WINDOW_TITLE);
    win = nk_find_window(ctx, title_hash, name);
    if (!win) {
        /* create new window */
        nk_size name_length = (nk_size)nk_strlen(name);
        win = (struct nk_window*)nk_create_window(ctx);
        NK_ASSERT(win);
        if (!win) return 0;

        if (flags & NK_WINDOW_BACKGROUND)
            nk_insert_window(ctx, win, NK_INSERT_FRONT);
        else nk_insert_window(ctx, win, NK_INSERT_BACK);
        nk_command_buffer_init(&win->buffer, &ctx->memory, NK_CLIPPING_ON);

        win->flags = flags;
        win->bounds = bounds;
        win->name = title_hash;
        name_length = NK_MIN(name_length, NK_WINDOW_MAX_NAME-1);
        NK_MEMCPY(win->name_string, name, name_length);
        win->name_string[name_length] = 0;
        win->popup.win = 0;
        if (!ctx->active)
            ctx->active = win;
    } else {
        /* update window */
        win->flags &= ~(nk_flags)(NK_WINDOW_PRIVATE-1);
        win->flags |= flags;
        if (!(win->flags & (NK_WINDOW_MOVABLE | NK_WINDOW_SCALABLE)))
            win->bounds = bounds;
        /* If this assert triggers you either:
         *
         * I.) Have more than one window with the same name or
         * II.) You forgot to actually draw the window.
         *      More specific you did not call `nk_clear` (nk_clear will be
         *      automatically called for you if you are using one of the
         *      provided demo backends). */
        NK_ASSERT(win->seq != ctx->seq);
        win->seq = ctx->seq;
        if (!ctx->active && !(win->flags & NK_WINDOW_HIDDEN)) {
            ctx->active = win;
            ctx->end = win;
        }
    }
    if (win->flags & NK_WINDOW_HIDDEN) {
        ctx->current = win;
        win->layout = 0;
        return 0;
    } else nk_start(ctx, win);

    /* window overlapping */
    if (!(win->flags & NK_WINDOW_HIDDEN) && !(win->flags & NK_WINDOW_NO_INPUT))
    {
        int inpanel, ishovered;
        struct nk_window *iter = win;
        float h = ctx->style.font->height + 2.0f * style->window.header.padding.y +
            (2.0f * style->window.header.label_padding.y);
        struct nk_rect win_bounds = (!(win->flags & NK_WINDOW_MINIMIZED))?
            win->bounds: nk_rect(win->bounds.x, win->bounds.y, win->bounds.w, h);

        /* activate window if hovered and no other window is overlapping this window */
        inpanel = nk_input_has_mouse_click_down_in_rect(&ctx->input, NK_BUTTON_LEFT, win_bounds, nk_true);
        inpanel = inpanel && ctx->input.mouse.buttons[NK_BUTTON_LEFT].clicked;
        ishovered = nk_input_is_mouse_hovering_rect(&ctx->input, win_bounds);
        if ((win != ctx->active) && ishovered && !ctx->input.mouse.buttons[NK_BUTTON_LEFT].down) {
            iter = win->next;
            while (iter) {
                struct nk_rect iter_bounds = (!(iter->flags & NK_WINDOW_MINIMIZED))?
                    iter->bounds: nk_rect(iter->bounds.x, iter->bounds.y, iter->bounds.w, h);
                if (NK_INTERSECT(win_bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter_bounds.x, iter_bounds.y, iter_bounds.w, iter_bounds.h) &&
                    (!(iter->flags & NK_WINDOW_HIDDEN)))
                    break;

                if (iter->popup.win && iter->popup.active && !(iter->flags & NK_WINDOW_HIDDEN) &&
                    NK_INTERSECT(win->bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter->popup.win->bounds.x, iter->popup.win->bounds.y,
                    iter->popup.win->bounds.w, iter->popup.win->bounds.h))
                    break;
                iter = iter->next;
            }
        }

        /* activate window if clicked */
        if (iter && inpanel && (win != ctx->end)) {
            iter = win->next;
            while (iter) {
                /* try to find a panel with higher priority in the same position */
                struct nk_rect iter_bounds = (!(iter->flags & NK_WINDOW_MINIMIZED))?
                iter->bounds: nk_rect(iter->bounds.x, iter->bounds.y, iter->bounds.w, h);
                if (NK_INBOX(ctx->input.mouse.pos.x, ctx->input.mouse.pos.y,
                    iter_bounds.x, iter_bounds.y, iter_bounds.w, iter_bounds.h) &&
                    !(iter->flags & NK_WINDOW_HIDDEN))
                    break;
                if (iter->popup.win && iter->popup.active && !(iter->flags & NK_WINDOW_HIDDEN) &&
                    NK_INTERSECT(win_bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter->popup.win->bounds.x, iter->popup.win->bounds.y,
                    iter->popup.win->bounds.w, iter->popup.win->bounds.h))
                    break;
                iter = iter->next;
            }
        }
        if (iter && !(win->flags & NK_WINDOW_ROM) && (win->flags & NK_WINDOW_BACKGROUND)) {
            win->flags |= (nk_flags)NK_WINDOW_ROM;
            iter->flags &= ~(nk_flags)NK_WINDOW_ROM;
            ctx->active = iter;
            if (!(iter->flags & NK_WINDOW_BACKGROUND)) {
                /* current window is active in that position so transfer to top
                 * at the highest priority in stack */
                nk_remove_window(ctx, iter);
                nk_insert_window(ctx, iter, NK_INSERT_BACK);
            }
        } else {
            if (!iter && ctx->end != win) {
                if (!(win->flags & NK_WINDOW_BACKGROUND)) {
                    /* current window is active in that position so transfer to top
                     * at the highest priority in stack */
                    nk_remove_window(ctx, win);
                    nk_insert_window(ctx, win, NK_INSERT_BACK);
                }
                win->flags &= ~(nk_flags)NK_WINDOW_ROM;
                ctx->active = win;
            }
            if (ctx->end != win && !(win->flags & NK_WINDOW_BACKGROUND))
                win->flags |= NK_WINDOW_ROM;
        }
    }
    win->layout = (struct nk_panel*)nk_create_panel(ctx);
    ctx->current = win;
    ret = nk_panel_begin(ctx, title, NK_PANEL_WINDOW);
    win->layout->offset_x = &win->scrollbar.x;
    win->layout->offset_y = &win->scrollbar.y;
    return ret;
}